

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogLikelihoodsMulti
          (BeagleCPUImpl<double,_1,_0> *this,int *parentBufferIndices,int *childBufferIndices,
          int *probabilityIndices,int *categoryWeightsIndices,int *stateFrequenciesIndices,
          int *scalingFactorsIndices,int count,double *outSumLogLikelihood)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  reference pvVar10;
  reference pvVar11;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int *in_stack_00000008;
  int in_stack_00000010;
  double *in_stack_00000018;
  int i_4;
  int i_3;
  double tmpSum;
  double tmpScaleFactor;
  int j_1;
  double *cumulativeScaleFactors;
  int cumulativeScalingFactorIndex;
  int i_2;
  double sumOverI;
  int k_2;
  int u;
  double *transMatrixPtr;
  int j;
  double sumOverJB;
  double sumOverJA;
  int i_1;
  double *partialsChildPtr;
  int w_1;
  int k_1;
  double weight_1;
  int u_2;
  int l_1;
  int stateCountModFour;
  int v_1;
  double *partialsChild;
  int i;
  int w;
  int stateChild;
  int k;
  double weight;
  int u_1;
  int l;
  int v;
  int *statesChild;
  int childIndex;
  double *freqs;
  double *wt;
  double *transMatrix;
  double *partialsParent;
  int subsetIndex;
  int returnCode;
  vector<double,_std::allocator<double>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  size_type in_stack_fffffffffffffe48;
  value_type vVar40;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe50;
  value_type vVar41;
  int local_178;
  int local_174;
  int local_15c;
  int local_14c;
  double local_148;
  int local_140;
  int local_13c;
  int local_12c;
  double local_128;
  double local_120;
  int local_114;
  int local_108;
  int local_104;
  int local_f8;
  int local_f4;
  int local_ec;
  int local_e0;
  int local_dc;
  int local_d4;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_84;
  int local_80;
  vector<double,_std::allocator<double>_> local_78 [2];
  vector<int,_std::allocator<int>_> local_48;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<int>::allocator((allocator<int> *)0x1748b6);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  std::allocator<int>::~allocator((allocator<int> *)0x1748dc);
  std::allocator<double>::allocator((allocator<double> *)0x1748fc);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  std::allocator<double>::~allocator((allocator<double> *)0x174922);
  local_80 = 0;
  for (local_84 = 0; local_84 < in_stack_00000010; local_84 = local_84 + 1) {
    lVar3 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)*(int *)(local_10 + (long)local_84 * 4) * 8);
    lVar4 = *(long *)(*(long *)(in_RDI + 0xd8) + (long)*(int *)(local_20 + (long)local_84 * 4) * 8);
    lVar5 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)*(int *)(local_28 + (long)local_84 * 4) * 8);
    lVar6 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)*(int *)(local_30 + (long)local_84 * 4) * 8);
    iVar2 = *(int *)(local_18 + (long)local_84 * 4);
    memset(*(void **)(in_RDI + 0xe0),0,
           (long)(*(int *)(in_RDI + 0x14) * *(int *)(in_RDI + 0x24)) << 3);
    if ((iVar2 < *(int *)(in_RDI + 0x10)) &&
       (*(long *)(*(long *)(in_RDI + 0xb8) + (long)iVar2 * 8) != 0)) {
      lVar7 = *(long *)(*(long *)(in_RDI + 0xb8) + (long)iVar2 * 8);
      local_bc = 0;
      for (local_c0 = 0; local_c0 < *(int *)(in_RDI + 0x34); local_c0 = local_c0 + 1) {
        local_c4 = 0;
        uVar1 = *(ulong *)(lVar5 + (long)local_c0 * 8);
        for (local_d4 = 0; local_d4 < *(int *)(in_RDI + 0x14); local_d4 = local_d4 + 1) {
          iVar2 = *(int *)(lVar7 + (long)local_d4 * 4);
          local_dc = local_c0 * *(int *)(in_RDI + 0x40);
          for (local_e0 = 0; local_e0 < *(int *)(in_RDI + 0x24); local_e0 = local_e0 + 1) {
            auVar13._8_8_ = 0;
            auVar13._0_8_ = uVar1;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_c4 * 8);
            auVar22._8_8_ = 0;
            auVar22._0_8_ =
                 *(double *)(lVar4 + (long)(local_dc + iVar2) * 8) *
                 *(double *)(lVar3 + (long)(local_bc + local_e0) * 8);
            auVar14 = vfmadd213sd_fma(auVar13,auVar22,auVar31);
            *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_c4 * 8) = auVar14._0_8_;
            local_c4 = local_c4 + 1;
            local_dc = *(int *)(in_RDI + 0x28) + local_dc;
          }
          local_bc = *(int *)(in_RDI + 0x2c) + local_bc;
        }
      }
    }
    else {
      lVar7 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)iVar2 * 8);
      local_ec = 0;
      iVar2 = *(int *)(in_RDI + 0x24);
      for (local_f4 = 0; local_f4 < *(int *)(in_RDI + 0x34); local_f4 = local_f4 + 1) {
        local_f8 = 0;
        uVar1 = *(ulong *)(lVar5 + (long)local_f4 * 8);
        for (local_104 = 0; local_104 < *(int *)(in_RDI + 0x14); local_104 = local_104 + 1) {
          local_108 = local_f4 * *(int *)(in_RDI + 0x40);
          lVar8 = lVar7 + (long)local_ec * 8;
          for (local_114 = 0; local_114 < *(int *)(in_RDI + 0x24); local_114 = local_114 + 1) {
            local_120 = 0.0;
            local_128 = 0.0;
            lVar9 = lVar4 + (long)local_108 * 8;
            for (local_12c = 0; local_12c < iVar2 / 4 << 2; local_12c = local_12c + 4) {
              auVar23._8_8_ = 0;
              auVar23._0_8_ = *(ulong *)(lVar9 + (long)local_12c * 8);
              auVar14._8_8_ = 0;
              auVar14._0_8_ = *(ulong *)(lVar8 + (long)local_12c * 8);
              auVar32._8_8_ = 0;
              auVar32._0_8_ = local_120;
              auVar14 = vfmadd213sd_fma(auVar14,auVar23,auVar32);
              auVar24._8_8_ = 0;
              auVar24._0_8_ = *(ulong *)(lVar9 + (long)(local_12c + 1) * 8);
              auVar15._8_8_ = 0;
              auVar15._0_8_ = *(ulong *)(lVar8 + (long)(local_12c + 1) * 8);
              auVar33._8_8_ = 0;
              auVar33._0_8_ = local_128;
              auVar15 = vfmadd213sd_fma(auVar15,auVar24,auVar33);
              auVar25._8_8_ = 0;
              auVar25._0_8_ = *(ulong *)(lVar9 + (long)(local_12c + 2) * 8);
              auVar16._8_8_ = 0;
              auVar16._0_8_ = *(ulong *)(lVar8 + (long)(local_12c + 2) * 8);
              auVar34._8_8_ = 0;
              auVar34._0_8_ = auVar14._0_8_;
              auVar14 = vfmadd213sd_fma(auVar16,auVar25,auVar34);
              local_120 = auVar14._0_8_;
              auVar26._8_8_ = 0;
              auVar26._0_8_ = *(ulong *)(lVar9 + (long)(local_12c + 3) * 8);
              auVar17._8_8_ = 0;
              auVar17._0_8_ = *(ulong *)(lVar8 + (long)(local_12c + 3) * 8);
              auVar35._8_8_ = 0;
              auVar35._0_8_ = auVar15._0_8_;
              auVar14 = vfmadd213sd_fma(auVar17,auVar26,auVar35);
              local_128 = auVar14._0_8_;
            }
            for (; local_12c < *(int *)(in_RDI + 0x24); local_12c = local_12c + 1) {
              auVar27._8_8_ = 0;
              auVar27._0_8_ = *(ulong *)(lVar9 + (long)local_12c * 8);
              auVar18._8_8_ = 0;
              auVar18._0_8_ = *(ulong *)(lVar8 + (long)local_12c * 8);
              auVar36._8_8_ = 0;
              auVar36._0_8_ = local_120;
              auVar14 = vfmadd213sd_fma(auVar18,auVar27,auVar36);
              local_120 = auVar14._0_8_;
            }
            auVar19._8_8_ = 0;
            auVar19._0_8_ = uVar1;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_f8 * 8);
            auVar28._8_8_ = 0;
            auVar28._0_8_ =
                 (local_120 + local_128) * *(double *)(lVar3 + (long)(local_ec + local_114) * 8);
            auVar14 = vfmadd213sd_fma(auVar19,auVar28,auVar37);
            *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_f8 * 8) = auVar14._0_8_;
            local_f8 = local_f8 + 1;
            local_108 = *(int *)(in_RDI + 0x24) + local_108 + 1;
          }
          local_ec = *(int *)(in_RDI + 0x2c) + local_ec;
        }
      }
    }
    local_13c = 0;
    for (local_140 = 0; local_140 < *(int *)(in_RDI + 0x14); local_140 = local_140 + 1) {
      local_148 = 0.0;
      for (local_14c = 0; local_14c < *(int *)(in_RDI + 0x24); local_14c = local_14c + 1) {
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(lVar6 + (long)local_14c * 8);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_13c * 8);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = local_148;
        auVar14 = vfmadd213sd_fma(auVar20,auVar29,auVar38);
        local_148 = auVar14._0_8_;
        local_13c = local_13c + 1;
      }
      if (*in_stack_00000008 != -1) {
        lVar3 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)in_stack_00000008[local_84] * 8);
        if (local_84 == 0) {
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_140);
          *pvVar10 = 0;
          vVar40 = *(value_type *)(lVar3 + (long)local_140 * 8);
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_78,(long)local_140);
          *pvVar11 = vVar40;
          for (local_15c = 1; local_15c < in_stack_00000010; local_15c = local_15c + 1) {
            vVar40 = *(value_type *)
                      (*(long *)(*(long *)(in_RDI + 0xc0) + (long)in_stack_00000008[local_15c] * 8)
                      + (long)local_140 * 8);
            vVar41 = vVar40;
            pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                (local_78,(long)local_140);
            if (*pvVar11 < vVar41) {
              in_stack_fffffffffffffe44 = local_15c;
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&local_48,(long)local_140);
              *pvVar10 = in_stack_fffffffffffffe44;
              pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                  (local_78,(long)local_140);
              *pvVar11 = vVar40;
            }
          }
        }
        in_stack_fffffffffffffe40 = local_84;
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_140);
        if (in_stack_fffffffffffffe40 != *pvVar10) {
          dVar12 = *(double *)(lVar3 + (long)local_140 * 8);
          pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                              (local_78,(long)local_140);
          dVar12 = exp(dVar12 - *pvVar11);
          local_148 = dVar12 * local_148;
        }
      }
      if (local_84 == 0) {
        *(double *)(*(long *)(in_RDI + 0x110) + (long)local_140 * 8) = local_148;
      }
      else if (local_84 == in_stack_00000010 + -1) {
        dVar12 = log(*(double *)(*(long *)(in_RDI + 0x110) + (long)local_140 * 8) + local_148);
        *(double *)(*(long *)(in_RDI + 0x110) + (long)local_140 * 8) = dVar12;
      }
      else {
        *(double *)(*(long *)(in_RDI + 0x110) + (long)local_140 * 8) =
             local_148 + *(double *)(*(long *)(in_RDI + 0x110) + (long)local_140 * 8);
      }
    }
  }
  if (*in_stack_00000008 != -1) {
    for (local_174 = 0; local_174 < *(int *)(in_RDI + 0x14); local_174 = local_174 + 1) {
      pvVar11 = std::vector<double,_std::allocator<double>_>::operator[](local_78,(long)local_174);
      *(double *)(*(long *)(in_RDI + 0x110) + (long)local_174 * 8) =
           *pvVar11 + *(double *)(*(long *)(in_RDI + 0x110) + (long)local_174 * 8);
    }
  }
  *in_stack_00000018 = 0.0;
  for (local_178 = 0; local_178 < *(int *)(in_RDI + 0x14); local_178 = local_178 + 1) {
    auVar30._8_8_ = 0;
    auVar30._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x110) + (long)local_178 * 8);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_178 * 8);
    auVar39._8_8_ = 0;
    auVar39._0_8_ = *in_stack_00000018;
    auVar14 = vfmadd213sd_fma(auVar21,auVar30,auVar39);
    *in_stack_00000018 = auVar14._0_8_;
  }
  if ((*in_stack_00000018 != *in_stack_00000018) ||
     (NAN(*in_stack_00000018) || NAN(*in_stack_00000018))) {
    local_80 = -8;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  return local_80;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogLikelihoodsMulti(const int* parentBufferIndices,
                                                                   const int* childBufferIndices,
                                                                   const int* probabilityIndices,
                                                                   const int* categoryWeightsIndices,
                                                                   const int* stateFrequenciesIndices,
                                                                   const int* scalingFactorsIndices,
                                                                   int count,
                                                                   double* outSumLogLikelihood) {

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    int returnCode = BEAGLE_SUCCESS;

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const REALTYPE* partialsParent = gPartials[parentBufferIndices[subsetIndex]];
        const REALTYPE* transMatrix = gTransitionMatrices[probabilityIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        int childIndex = childBufferIndices[subsetIndex];

        memset(integrationTmp, 0, (kPatternCount * kStateCount)*sizeof(REALTYPE));

        if (childIndex < kTipCount && gTipStates[childIndex]) { // Integrate against a state at the child

            const int* statesChild = gTipStates[childIndex];
            int v = 0; // Index for parent partials

            for(int l = 0; l < kCategoryCount; l++) {
                int u = 0; // Index in resulting product-partials (summed over categories)
                const REALTYPE weight = wt[l];
                for(int k = 0; k < kPatternCount; k++) {

                    const int stateChild = statesChild[k];  // DISCUSSION PT: Does it make sense to change the order of the partials,
                    // so we can interchange the patterCount and categoryCount loop order?
                    int w =  l * kMatrixSize;
                    for(int i = 0; i < kStateCount; i++) {
                        integrationTmp[u] += transMatrix[w + stateChild] * partialsParent[v + i] * weight;
                        u++;

                        w += kTransPaddedStateCount;
                    }
                    v += kPartialsPaddedStateCount;
                }
            }
        } else {
            const REALTYPE* partialsChild = gPartials[childIndex];
            int v = 0;
            int stateCountModFour = (kStateCount / 4) * 4;

            for(int l = 0; l < kCategoryCount; l++) {
                int u = 0;
                const REALTYPE weight = wt[l];
                for(int k = 0; k < kPatternCount; k++) {
                    int w = l * kMatrixSize;
                    const REALTYPE* partialsChildPtr = &partialsChild[v];
                    for(int i = 0; i < kStateCount; i++) {
                        double sumOverJA = 0.0, sumOverJB = 0.0;
                        int j = 0;
                        const REALTYPE* transMatrixPtr = &transMatrix[w];
                        for (; j < stateCountModFour; j += 4) {
                            sumOverJA += transMatrixPtr[j + 0] * partialsChildPtr[j + 0];
                            sumOverJB += transMatrixPtr[j + 1] * partialsChildPtr[j + 1];
                            sumOverJA += transMatrixPtr[j + 2] * partialsChildPtr[j + 2];
                            sumOverJB += transMatrixPtr[j + 3] * partialsChildPtr[j + 3];

                        }
                        for (; j < kStateCount; j++) {
                            sumOverJA += transMatrixPtr[j] * partialsChildPtr[j];
                        }
//                        for(int j = 0; j < kStateCount; j++) {
//                            sumOverJ += transMatrix[w] * partialsChild[v + j];
//                            w++;
//                        }
                        integrationTmp[u] += (sumOverJA + sumOverJB) * partialsParent[v + i] * weight;
                        u++;

                        w += kStateCount;

                        // increment for the extra column at the end
                        w += T_PAD;
                    }
                    v += kPartialsPaddedStateCount;
                }
            }

        }
        int u = 0;
        for(int k = 0; k < kPatternCount; k++) {
            REALTYPE sumOverI = 0.0;
            for(int i = 0; i < kStateCount; i++) {
                sumOverI += freqs[i] * integrationTmp[u];
                u++;
            }

            if (scalingFactorsIndices[0] != BEAGLE_OP_NONE) {
                int cumulativeScalingFactorIndex;
                cumulativeScalingFactorIndex = scalingFactorsIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        tmpScaleFactor = gScaleBuffers[scalingFactorsIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sumOverI *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }



            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sumOverI;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sumOverI;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sumOverI;
            }

        }

    }

    if (scalingFactorsIndices[0] != BEAGLE_OP_NONE) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }


    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;
}